

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O0

void __thiscall
despot::MemoryPool<despot::RegDemoState>::~MemoryPool(MemoryPool<despot::RegDemoState> *this)

{
  MemoryPool<despot::RegDemoState> *this_local;
  
  DeleteAll(this);
  std::vector<despot::RegDemoState_*,_std::allocator<despot::RegDemoState_*>_>::~vector
            (&this->freelist_);
  std::
  vector<despot::MemoryPool<despot::RegDemoState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::RegDemoState>::Chunk_*>_>
  ::~vector(&this->chunks_);
  return;
}

Assistant:

~MemoryPool() {
		DeleteAll();
	}